

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall
libtorrent::save_resume_data_alert::~save_resume_data_alert(save_resume_data_alert *this)

{
  save_resume_data_alert *this_local;
  
  add_torrent_params::~add_torrent_params(&this->params);
  torrent_alert::~torrent_alert(&this->super_torrent_alert);
  return;
}

Assistant:

struct TORRENT_EXPORT save_resume_data_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT save_resume_data_alert(aux::stack_allocator& alloc
			, add_torrent_params&& params
			, torrent_handle const& h);
		TORRENT_UNEXPORT save_resume_data_alert(aux::stack_allocator& alloc
			, add_torrent_params const& params
			, torrent_handle const& h) = delete;

		TORRENT_DEFINE_ALERT_PRIO(save_resume_data_alert, 37, alert_priority::critical)

		static inline constexpr alert_category_t static_category = alert_category::storage;
		std::string message() const override;

		// the ``params`` object is populated with the torrent file whose resume
		// data was saved. It is suitable to be:
		//
		// * added to a session with add_torrent() or async_add_torrent()
		// * saved to disk with write_resume_data()
		// * turned into a magnet link with make_magnet_uri()
		// * saved as a .torrent file with write_torrent_file()
		add_torrent_params params;

#if TORRENT_ABI_VERSION == 1
		// points to the resume data.
		TORRENT_DEPRECATED std::shared_ptr<entry> resume_data;
#endif
	}